

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O1

void __thiscall Imf_2_5::StdIFStream::StdIFStream(StdIFStream *this,char *fileName)

{
  ifstream *this_00;
  
  IStream::IStream(&this->super_IStream,fileName);
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__StdIFStream_0043c468;
  this_00 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this_00,fileName,_S_bin);
  this->_is = this_00;
  this->_deleteStream = true;
  if (((byte)this_00[*(long *)(*(long *)this_00 + -0x18) + 0x20] & 5) != 0) {
    (**(code **)(*(long *)this_00 + 8))(this_00);
    Iex_2_5::throwErrnoExc();
  }
  return;
}

Assistant:

StdIFStream::StdIFStream (const char fileName[]):
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream (fileName),
    _is (make_ifstream (fileName)),
    _deleteStream (true)
{
    if (!*_is)
    {
	delete _is;
	IEX_NAMESPACE::throwErrnoExc();
    }
}